

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall
QAbstractSpinBox::setButtonSymbols(QAbstractSpinBox *this,ButtonSymbols buttonSymbols)

{
  QAbstractSpinBoxPrivate *pQVar1;
  ButtonSymbols in_ESI;
  QWidget *in_RDI;
  QAbstractSpinBoxPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QAbstractSpinBox *)0x684ea0);
  if (pQVar1->buttonSymbols != in_ESI) {
    pQVar1->buttonSymbols = in_ESI;
    (**(code **)(*(long *)&pQVar1->super_QWidgetPrivate + 0x100))();
    QWidget::updateGeometry(in_RDI);
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QAbstractSpinBox::setButtonSymbols(ButtonSymbols buttonSymbols)
{
    Q_D(QAbstractSpinBox);
    if (d->buttonSymbols != buttonSymbols) {
        d->buttonSymbols = buttonSymbols;
        d->updateEditFieldGeometry();
        updateGeometry();
        update();
    }
}